

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

void profile_trigger(ProfileState *ps)

{
  byte bVar1;
  int iVar2;
  global_State *g_00;
  int local_2c;
  int local_28;
  int local_24;
  int st;
  uint8_t mask;
  global_State *g;
  ProfileState *ps_local;
  
  g_00 = ps->g;
  ps->samples = ps->samples + 1;
  bVar1 = g_00->hookmask;
  if ((bVar1 & 0xe0) == 0) {
    iVar2 = g_00->vmstate;
    if (iVar2 < 0) {
      if (iVar2 == -1) {
        local_28 = 0x49;
      }
      else {
        if (iVar2 == -2) {
          local_2c = 0x43;
        }
        else {
          local_2c = 0x4a;
          if (iVar2 == -3) {
            local_2c = 0x47;
          }
        }
        local_28 = local_2c;
      }
      local_24 = local_28;
    }
    else {
      local_24 = 0x4e;
    }
    ps->vmstate = local_24;
    g_00->hookmask = bVar1 | 0x80;
    lj_dispatch_update(g_00);
  }
  return;
}

Assistant:

static void profile_trigger(ProfileState *ps)
{
  global_State *g = ps->g;
  uint8_t mask;
  profile_lock(ps);
  ps->samples++;  /* Always increment number of samples. */
  mask = g->hookmask;
  if (!(mask & (HOOK_PROFILE|HOOK_VMEVENT|HOOK_GC))) {  /* Set profile hook. */
    int st = g->vmstate;
    ps->vmstate = st >= 0 ? 'N' :
		  st == ~LJ_VMST_INTERP ? 'I' :
		  st == ~LJ_VMST_C ? 'C' :
		  st == ~LJ_VMST_GC ? 'G' : 'J';
    g->hookmask = (mask | HOOK_PROFILE);
    lj_dispatch_update(g);
  }
  profile_unlock(ps);
}